

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

char * __thiscall
MemoryLeakDetector::allocMemory
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,size_t size,char *file,
          size_t line,bool allocatNodesSeperately)

{
  byte bVar1;
  TestMemoryAllocator *allocator_00;
  MemoryLeakDetectorNode *pMVar2;
  size_t in_RCX;
  TestMemoryAllocator *in_RDX;
  MemoryLeakDetector *in_RSI;
  MemoryLeakDetector *in_RDI;
  TestMemoryAllocator *in_R8;
  byte in_R9B;
  size_t unaff_retaddr;
  MemoryLeakDetectorNode *node;
  char *memory;
  undefined8 in_stack_ffffffffffffffa8;
  undefined1 allocatNodesSeperately_00;
  size_t in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  MemoryLeakDetector *this_00;
  char *local_8;
  
  allocatNodesSeperately_00 = (undefined1)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
  bVar1 = in_R9B & 1;
  this_00 = in_RDI;
  allocator_00 = (TestMemoryAllocator *)
                 allocateMemoryWithAccountingInformation
                           (in_RSI,in_RDX,in_RCX,(char *)in_R8,
                            CONCAT17(in_R9B,in_stack_ffffffffffffffc8) & 0x1ffffffffffffff,
                            SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x38,0));
  if (allocator_00 == (TestMemoryAllocator *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    pMVar2 = createMemoryLeakAccountingInformation
                       ((MemoryLeakDetector *)CONCAT17(bVar1,in_stack_ffffffffffffffc8),allocator_00
                        ,in_stack_ffffffffffffffb8,(char *)in_RDI,(bool)allocatNodesSeperately_00);
    storeLeakInformation
              (this_00,(MemoryLeakDetectorNode *)in_RSI,(char *)in_RDX,in_RCX,in_R8,
               (char *)CONCAT17(bVar1,in_stack_ffffffffffffffc8),unaff_retaddr);
    local_8 = *(char **)(pMVar2 + 0x10);
  }
  return local_8;
}

Assistant:

char* MemoryLeakDetector::allocMemory(TestMemoryAllocator* allocator, size_t size, const char* file, size_t line, bool allocatNodesSeperately)
{
#ifdef CPPUTEST_DISABLE_MEM_CORRUPTION_CHECK
   allocatNodesSeperately = true;
#endif
    /* With malloc, it is harder to guarantee that the allocator free is called.
     * This is because operator new is overloaded via linker symbols, but malloc just via #defines.
     * If the same allocation is used and the wrong free is called, it will deallocate the memory leak information
     * without the memory leak detector ever noticing it!
     * So, for malloc, we'll allocate the memory separately so we can detect this and give a proper error.
     */

    char* memory = allocateMemoryWithAccountingInformation(allocator, size, file, line, allocatNodesSeperately);
    if (memory == NULLPTR) return NULLPTR;
    MemoryLeakDetectorNode* node = createMemoryLeakAccountingInformation(allocator, size, memory, allocatNodesSeperately);

    storeLeakInformation(node, memory, size, allocator, file, line);
    return node->memory_;
}